

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int read_line_alloc(void *in,DataSourceType in_type,SXML_CHAR **line,int *sz_line,int i0,
                   SXML_CHAR from,SXML_CHAR to,int keep_fromto,SXML_CHAR interest,
                   int *interest_count)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  void *pvVar4;
  int local_70;
  int local_6c;
  _func_int_void_ptr *meos;
  _func_int_void_ptr *mgetc;
  int local_50;
  int ret;
  int n;
  int c;
  SXML_CHAR *pt;
  SXML_CHAR ch;
  int init_sz;
  SXML_CHAR from_local;
  int *piStack_30;
  int i0_local;
  int *sz_line_local;
  SXML_CHAR **line_local;
  void *pvStack_18;
  DataSourceType in_type_local;
  void *in_local;
  
  pt._4_4_ = 0;
  pcVar2 = fgetc;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar2 = _bgetc;
  }
  pcVar3 = feof;
  if (in_type == DATA_SOURCE_BUFFER) {
    pcVar3 = _beob;
  }
  if ((in == (void *)0x0) || (line == (SXML_CHAR **)0x0)) {
    in_local._4_4_ = 0;
  }
  else {
    if (to == '\0') {
      to = '\n';
    }
    ch = from;
    init_sz = i0;
    piStack_30 = sz_line;
    sz_line_local = (int *)line;
    line_local._4_4_ = in_type;
    pvStack_18 = in;
    if (interest_count != (int *)0x0) {
      *interest_count = 0;
    }
    while( true ) {
      iVar1 = (*pcVar2)(pvStack_18);
      pt._3_1_ = (char)iVar1;
      if (iVar1 == -1) break;
      if ((interest_count != (int *)0x0) && (pt._3_1_ == interest)) {
        *interest_count = *interest_count + 1;
      }
      if ((pt._3_1_ == ch) || (ch == '\0')) break;
    }
    if (piStack_30 == (int *)0x0) {
      piStack_30 = (int *)((long)&pt + 4);
    }
    if ((*(long *)sz_line_local == 0) || (*piStack_30 == 0)) {
      if (*piStack_30 == 0) {
        *piStack_30 = 0x100;
      }
      pvVar4 = malloc((long)*piStack_30);
      *(void **)sz_line_local = pvVar4;
      if (*(long *)sz_line_local == 0) {
        return 0;
      }
    }
    if (init_sz < 0) {
      init_sz = 0;
    }
    local_6c = init_sz;
    if (init_sz < *piStack_30) {
      local_50 = init_sz;
      if (iVar1 == -1) {
        *(undefined1 *)(*(long *)sz_line_local + (long)init_sz) = 0;
        iVar1 = (*pcVar3)(pvStack_18);
        if (iVar1 == 0) {
          local_6c = 0;
        }
        else {
        }
        in_local._4_4_ = local_6c;
      }
      else {
        if ((pt._3_1_ != ch) || (keep_fromto != 0)) {
          local_50 = init_sz + 1;
          *(char *)(*(long *)sz_line_local + (long)init_sz) = pt._3_1_;
          if (*piStack_30 <= local_50) {
            *piStack_30 = *piStack_30 + 0x100;
            pvVar4 = realloc(*(void **)sz_line_local,(long)*piStack_30);
            if (pvVar4 == (void *)0x0) {
              return 0;
            }
            *(void **)sz_line_local = pvVar4;
          }
        }
        *(undefined1 *)(*(long *)sz_line_local + (long)local_50) = 0;
        do {
          iVar1 = (*pcVar2)(pvStack_18);
          if (iVar1 == -1) {
            *(undefined1 *)(*(long *)sz_line_local + (long)local_50) = 0;
            iVar1 = (*pcVar3)(pvStack_18);
            if (iVar1 == 0) {
              local_70 = 0;
            }
            else {
              local_70 = local_50;
            }
            mgetc._4_4_ = local_70;
            goto LAB_00109160;
          }
          pt._3_1_ = (char)iVar1;
          if ((interest_count != (int *)0x0) && (pt._3_1_ == interest)) {
            *interest_count = *interest_count + 1;
          }
          *(char *)(*(long *)sz_line_local + (long)local_50) = pt._3_1_;
          if ((pt._3_1_ != to) || (((keep_fromto != 0 && (to != '\0')) && (pt._3_1_ == to)))) {
            local_50 = local_50 + 1;
          }
          if (*piStack_30 <= local_50) {
            *piStack_30 = *piStack_30 + 0x100;
            pvVar4 = realloc(*(void **)sz_line_local,(long)*piStack_30);
            if (pvVar4 == (void *)0x0) {
              mgetc._4_4_ = 0;
              goto LAB_00109160;
            }
            *(void **)sz_line_local = pvVar4;
          }
          *(undefined1 *)(*(long *)sz_line_local + (long)local_50) = 0;
        } while (pt._3_1_ != to);
        mgetc._4_4_ = local_50;
LAB_00109160:
        in_local._4_4_ = mgetc._4_4_;
      }
    }
    else {
      in_local._4_4_ = 0;
    }
  }
  return in_local._4_4_;
}

Assistant:

int read_line_alloc(void* in, DataSourceType in_type, SXML_CHAR** line, int* sz_line, int i0, SXML_CHAR from, SXML_CHAR to, int keep_fromto, SXML_CHAR interest, int* interest_count)
{
	int init_sz = 0;
	SXML_CHAR ch, *pt;
	int c;
	int n, ret;
	int (*mgetc)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_bgetc : (int(*)(void*))sx_fgetc);
	int (*meos)(void* ds) = (in_type == DATA_SOURCE_BUFFER ? (int(*)(void*))_beob : (int(*)(void*))sx_feof);
	
	if (in == NULL || line == NULL)
		return 0;
	
	if (to == NULC)
		to = C2SX('\n');
	/* Search for character 'from' */
	if (interest_count != NULL)
		*interest_count = 0;
	for (;;) {
		/* Reaching EOF before 'to' char is not an error but should trigger 'line' alloc and init to '' */
		c = mgetc(in);
		ch = (SXML_CHAR)c;
		if (c == EOF)
			break;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		/* If 'from' is '\0', we stop here */
		if (ch == from || from == NULC)
			break;
	}
	
	if (sz_line == NULL)
		sz_line = &init_sz;
	
	if (*line == NULL || *sz_line == 0) {
		if (*sz_line == 0)
			*sz_line = MEM_INCR_RLA;
		*line = __malloc(*sz_line*sizeof(SXML_CHAR));
		if (*line == NULL)
			return 0;
	}
	if (i0 < 0)
		i0 = 0;
	if (i0 >= *sz_line)
		return 0;
	
	n = i0;
	if (c == CEOF) { /* EOF reached before 'to' char => return the empty string */
		(*line)[n] = NULC;
		return meos(in) ? n : 0; /* Error if not EOF */
	}
	if (ch != from || keep_fromto) {
		(*line)[n++] = ch;
		if (n >= *sz_line) {
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				return 0;
			} else
				*line = pt;
		}
	}
	(*line)[n] = NULC;
	ret = 0;
	for (;;) {
		if ((c = mgetc(in)) == CEOF) { /* EOF or error */
			(*line)[n] = NULC;
			ret = meos(in) ? n : 0;
			break;
		}
		ch = (SXML_CHAR)c;
		if (interest_count != NULL && ch == interest)
			(*interest_count)++;
		(*line)[n] = ch;
		if (ch != to || (keep_fromto && to != NULC && ch == to)) /* If we reached the 'to' character and we keep it, we still need to add the extra '\0' */
			n++;
		if (n >= *sz_line) { /* Too many characters for our line => realloc some more */
			*sz_line += MEM_INCR_RLA;
			pt = __realloc(*line, *sz_line*sizeof(SXML_CHAR));
			if (pt == NULL) {
				ret = 0;
				break;
			} else
				*line = pt;
		}
		(*line)[n] = NULC; /* If we reached the 'to' character and we want to strip it, 'n' hasn't changed and 'line[n]' (which is 'to') will be replaced by '\0' */
		if (ch == to) {
			ret = n;
			break;
		}
	}
	
#if 0 /* Automatic buffer resize is deactivated */
	/* Resize line to the exact size */
	pt = __realloc(*line, (n+1)*sizeof(SXML_CHAR));
	if (pt != NULL)
		*line = pt;
#endif
	
	return ret;
}